

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cCopyImageTests.cpp
# Opt level: O2

IterateResult __thiscall gl4cts::CopyImage::MissMatchObjectTest::iterate(MissMatchObjectTest *this)

{
  pointer ptVar1;
  ostringstream *this_00;
  GLenum GVar2;
  pointer ptVar3;
  Context *context;
  int iVar4;
  GLuint GVar5;
  GLenum GVar6;
  IterateResult IVar7;
  undefined4 extraout_var;
  uint uVar8;
  GLuint temp;
  Enum<int,_2UL> local_1f8;
  Enum<int,_2UL> local_1e8;
  Enum<int,_2UL> local_1d8;
  Enum<int,_2UL> local_1c8;
  Enum<int,_2UL> local_1b8;
  undefined1 local_1a8 [384];
  
  iVar4 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  temp = 0;
  ptVar3 = (this->m_test_cases).
           super__Vector_base<gl4cts::CopyImage::MissMatchObjectTest::testCase,_std::allocator<gl4cts::CopyImage::MissMatchObjectTest::testCase>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ptVar1 = ptVar3 + this->m_test_case_index;
  GVar2 = ptVar3[this->m_test_case_index].m_obj_target;
  context = (this->super_TestCase).m_context;
  if (GVar2 == 0x8d41) {
    GVar5 = Utils::prepareRenderBuffer(context,0x8058);
    this->m_dst_name = GVar5;
    GVar5 = Utils::prepareRenderBuffer((this->super_TestCase).m_context,0x8058);
    this->m_src_name = GVar5;
  }
  else {
    GVar5 = Utils::prepareTex16x16x6(context,GVar2,0x8058,0x1908,0x1401,&temp);
    this->m_dst_name = GVar5;
    GVar5 = Utils::prepareTex16x16x6
                      ((this->super_TestCase).m_context,ptVar1->m_obj_target,0x8058,0x1908,0x1401,
                       &temp);
    this->m_src_name = GVar5;
    Utils::makeTextureComplete
              ((this->super_TestCase).m_context,ptVar1->m_obj_target,this->m_dst_name,0,0);
    Utils::makeTextureComplete
              ((this->super_TestCase).m_context,ptVar1->m_obj_target,this->m_src_name,0,0);
    GVar5 = this->m_src_name;
  }
  (**(code **)(CONCAT44(extraout_var,iVar4) + 0x310))
            (GVar5,ptVar1->m_src_target,0,0,0,0,this->m_dst_name,ptVar1->m_dst_target,0,0,0,0,1,1,1)
  ;
  GVar6 = (**(code **)(CONCAT44(extraout_var,iVar4) + 0x800))();
  GVar2 = ptVar1->m_expected_result;
  clean(this);
  if (GVar2 == GVar6) {
    tcu::TestContext::setTestResult
              (((this->super_TestCase).m_context)->m_testCtx,QP_TEST_RESULT_PASS,"Pass");
    uVar8 = this->m_test_case_index + 1;
    this->m_test_case_index = uVar8;
    IVar7 = (IterateResult)
            ((ulong)uVar8 <
            (ulong)((long)(this->m_test_cases).
                          super__Vector_base<gl4cts::CopyImage::MissMatchObjectTest::testCase,_std::allocator<gl4cts::CopyImage::MissMatchObjectTest::testCase>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->m_test_cases).
                          super__Vector_base<gl4cts::CopyImage::MissMatchObjectTest::testCase,_std::allocator<gl4cts::CopyImage::MissMatchObjectTest::testCase>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 4));
  }
  else {
    local_1a8._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
    this_00 = (ostringstream *)(local_1a8 + 8);
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::operator<<((ostream *)this_00,"Failure. Expected result: ");
    local_1b8.m_value = ptVar1->m_expected_result;
    local_1b8.m_getName = glu::getErrorName;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1b8,(ostream *)this_00);
    std::operator<<((ostream *)this_00," got: ");
    local_1c8.m_getName = glu::getErrorName;
    local_1c8.m_value = GVar6;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1c8,(ostream *)this_00);
    std::operator<<((ostream *)this_00,". Object target: ");
    local_1d8.m_value = ptVar1->m_obj_target;
    local_1d8.m_getName = glu::getTextureTargetName;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1d8,(ostream *)this_00);
    std::operator<<((ostream *)this_00,". Source target: ");
    local_1e8.m_value = ptVar1->m_src_target;
    local_1e8.m_getName = glu::getTextureTargetName;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1e8,(ostream *)this_00);
    std::operator<<((ostream *)this_00,". Destination target: ");
    local_1f8.m_value = ptVar1->m_dst_target;
    local_1f8.m_getName = glu::getTextureTargetName;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1f8,(ostream *)this_00);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_00);
    tcu::TestContext::setTestResult
              (((this->super_TestCase).m_context)->m_testCtx,QP_TEST_RESULT_FAIL,"Fail");
    IVar7 = STOP;
  }
  return IVar7;
}

Assistant:

tcu::TestNode::IterateResult MissMatchObjectTest::iterate()
{
	GLenum						 error	 = GL_NO_ERROR;
	const Functions&			 gl		   = m_context.getRenderContext().getFunctions();
	tcu::TestNode::IterateResult it_result = tcu::TestNode::STOP;
	bool						 result	= false;
	GLuint						 temp	  = 0;
	const testCase&				 test_case = m_test_cases[m_test_case_index];

	try
	{
		/* Prepare objects */
		if (GL_RENDERBUFFER == test_case.m_obj_target)
		{
			m_dst_name = Utils::prepareRenderBuffer(m_context, GL_RGBA8);
			m_src_name = Utils::prepareRenderBuffer(m_context, GL_RGBA8);
		}
		else
		{
			m_dst_name =
				Utils::prepareTex16x16x6(m_context, test_case.m_obj_target, GL_RGBA8, GL_RGBA, GL_UNSIGNED_BYTE, temp);
			m_src_name =
				Utils::prepareTex16x16x6(m_context, test_case.m_obj_target, GL_RGBA8, GL_RGBA, GL_UNSIGNED_BYTE, temp);

			/* Make textures complete */
			Utils::makeTextureComplete(m_context, test_case.m_obj_target, m_dst_name, 0 /* base */, 0 /* max */);
			Utils::makeTextureComplete(m_context, test_case.m_obj_target, m_src_name, 0 /* base */, 0 /* max */);
		}
	}
	catch (tcu::Exception& exc)
	{
		clean();
		throw exc;
	}

	/* Execute CopyImageSubData */
	gl.copyImageSubData(m_src_name, test_case.m_src_target, 0 /* srcLevel */, 0 /* srcX */, 0 /* srcY */, 0 /* srcZ */,
						m_dst_name, test_case.m_dst_target, 0 /* dstLevel */, 0 /* dstX */, 0 /* dstY */, 0 /* dstZ */,
						1 /* srcWidth */, 1 /* srcHeight */, 1 /* srcDepth */);

	/* Verify generated error */
	error  = gl.getError();
	result = (test_case.m_expected_result == error);

	/* Remove resources */
	clean();

	if (true == result)
	{
		m_context.getTestContext().setTestResult(QP_TEST_RESULT_PASS, "Pass");

		/* Increase index */
		m_test_case_index += 1;

		/* Are there any test cases left */
		if (m_test_cases.size() > m_test_case_index)
		{
			it_result = tcu::TestNode::CONTINUE;
		}
	}
	else
	{
		m_context.getTestContext().getLog()
			<< tcu::TestLog::Message << "Failure. Expected result: " << glu::getErrorStr(test_case.m_expected_result)
			<< " got: " << glu::getErrorStr(error)
			<< ". Object target: " << glu::getTextureTargetStr(test_case.m_obj_target)
			<< ". Source target: " << glu::getTextureTargetStr(test_case.m_src_target)
			<< ". Destination target: " << glu::getTextureTargetStr(test_case.m_dst_target) << tcu::TestLog::EndMessage;

		m_context.getTestContext().setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	/* Done */
	return it_result;
}